

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O1

char16_t PAL_towlower(char16_t c)

{
  BOOL BVar1;
  char16_t cVar2;
  UnicodeDataRec local_20;
  UnicodeDataRec dataRec;
  
  if (!PAL_InitializeChakraCoreCalled) {
LAB_001ca1db:
    abort();
  }
  if ((ushort)c < 0x80) {
    cVar2 = c | 0x20;
    if (0x19 < (ushort)(c + L'﾿')) {
      cVar2 = c;
    }
  }
  else {
    BVar1 = GetUnicodeData((uint)(ushort)c,&local_20);
    if ((BVar1 != 0) &&
       ((byte)(local_20.nOpposingCase == L'\0' | ((byte)local_20.C1_TYPE_FLAGS & 2) >> 1) != 1)) {
      c = local_20.nOpposingCase;
    }
    cVar2 = c;
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_001ca1db;
  }
  return cVar2;
}

Assistant:

char16_t
__cdecl
PAL_towlower( char16_t c )
{
    PERF_ENTRY(towlower);
    ENTRY("towlower (c=%d)\n", c);
    if(c < 128)
    {//fast path for ascii characters
        if(c >= 'A' && c <= 'Z')
        {
            c += ('a' - 'A');
            PERF_EXIT(towlower);
            LOGEXIT("towlower returns int %d\n", c );
            return c;
        }
        else
        {
            PERF_EXIT(towlower);
            LOGEXIT("towlower returns int %d\n", c );
            return c;
        }
    }
    else
    {
    #if HAVE_COREFOUNDATION
        if (!PAL_iswlower(c))
        {
            CFMutableStringRef cfString = CFStringCreateMutable(
                                                kCFAllocatorDefault, 1);
            if (cfString != NULL)
            {
                CFStringAppendCharacters(cfString, (const UniChar*)&c, 1);
                CFStringLowercase(cfString, NULL);
                c = CFStringGetCharacterAtIndex(cfString, 0);
                CFRelease(cfString);
            }
        }
        LOGEXIT("towlower returns int %d\n", c );
        PERF_EXIT(towlower);
        return c;
    #else   /* HAVE_COREFOUNDATION */
        UnicodeDataRec dataRec;

        if (!GetUnicodeData(c, &dataRec))
        {
            TRACE( "Unable to retrieve unicode data for the character %c.\n", c );
            LOGEXIT("towlower returns int %d\n", c );
            PERF_EXIT(towlower);
            return c;
        }

        if ( (dataRec.C1_TYPE_FLAGS & C1_LOWER) || (dataRec.nOpposingCase ==  0 ))
        {
            LOGEXIT("towlower returns int %d\n", c );
            PERF_EXIT(towlower);
            return c;
        }
        else
        {
            LOGEXIT("towlower returns int %d\n", dataRec.nOpposingCase );
            PERF_EXIT(towlower);
            return dataRec.nOpposingCase;
        }
    #endif  /* HAVE_COREFOUNDATION */
    }
}